

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O1

void FsOpenWindow(FsOpenWindowOption *opt)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  Display *pDVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  time_t tVar12;
  time_t tVar13;
  int iVar14;
  ulong uVar15;
  undefined4 uVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  char cVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  uint local_204;
  GLfloat shininess [4];
  GLfloat spc [4];
  GLfloat amb [4];
  GLfloat dif [4];
  uint local_168;
  uint local_164;
  XWMHints wmHints;
  XSetWindowAttributes swa;
  
  uVar2 = opt->x0;
  uVar11 = (ulong)uVar2;
  uVar3 = opt->y0;
  iVar4 = opt->wid;
  iVar5 = opt->hei;
  bVar1 = opt->useDoubleBuffer;
  pcVar6 = opt->windowTitle;
  FsXCreateKeyMapping();
  memset(fsKeyPress,0,0x194);
  pcVar18 = "Main Window";
  if (pcVar6 != (char *)0x0) {
    pcVar18 = pcVar6;
  }
  ysXDsp = (Display *)XOpenDisplay(0);
  if (ysXDsp == (Display *)0x0) {
    FsOpenWindow();
LAB_0010fbf7:
    FsOpenWindow();
  }
  else {
    puts("Opened display.");
    iVar9 = glXQueryExtension(ysXDsp,0,0);
    if (iVar9 == 0) goto LAB_0010fbf7;
    puts("Acquired GLX extension.");
    uVar16 = *(undefined4 *)(ysXDsp + 0xe0);
    if (bVar1 == false) {
      ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,uVar16,ysGlxCfgSingle);
      cVar20 = '\x01';
      if (ysXVis == (XVisualInfo *)0x0) {
        uVar16 = *(undefined4 *)(ysXDsp + 0xe0);
        ysXVis = (XVisualInfo *)0x0;
        goto LAB_0010f693;
      }
    }
    else {
LAB_0010f693:
      ysXVis = (XVisualInfo *)glXChooseVisual(ysXDsp,uVar16,ysGlxCfgDouble);
      cVar20 = bVar1;
    }
    puts("Chose visual.");
    if (ysXVis != (XVisualInfo *)0x0) {
      ysXCMap = XCreateColormap(ysXDsp,*(undefined8 *)
                                        (*(long *)(ysXDsp + 0xe8) + 0x10 +
                                        (long)ysXVis->screen * 0x80),ysXVis->visual,0);
      puts("Created colormap.");
      ysGlRC = (GLXContext)glXCreateContext(ysXDsp,ysXVis,0,1);
      if (ysGlRC != (GLXContext)0x0) {
        puts("Created OpenGL context.");
        swa.colormap = ysXCMap;
        swa.border_pixel = 0;
        swa.event_mask = 0x2804f;
        ysXWnd = XCreateWindow(ysXDsp,*(undefined8 *)
                                       (*(long *)(ysXDsp + 0xe8) + 0x10 +
                                       (long)ysXVis->screen * 0x80),uVar11,(ulong)uVar3,iVar4,iVar5,
                               1,ysXVis->depth,1,ysXVis->visual,0x2808,&swa);
        puts("Created Window.");
        ysXWid = iVar4;
        ysXHei = iVar5;
        ysXlupX = uVar2;
        ysXlupY = uVar3;
        XStoreName(ysXDsp,ysXWnd,pcVar18);
        XSetWMHints(ysXDsp,ysXWnd);
        XSetIconName(ysXDsp,ysXWnd,pcVar18);
        XMapWindow(ysXDsp,ysXWnd);
        pDVar8 = ysXDsp;
        tVar12 = time((time_t *)0x0);
        do {
          tVar13 = time((time_t *)0x0);
        } while (tVar13 == tVar12);
        iVar9 = uVar2 + 1;
        uVar17 = uVar3 + 1;
        tVar12 = time((time_t *)0x0);
        uVar15 = uVar11;
        local_204 = uVar3;
        do {
          tVar13 = time((time_t *)0x0);
          if (tVar12 < tVar13) break;
          iVar14 = (int)uVar15;
          if ((iVar9 != iVar14) || (uVar17 != local_204)) {
            XMoveWindow(pDVar8,ysXWnd,uVar15,local_204);
            iVar9 = iVar14;
            uVar17 = local_204;
          }
          iVar10 = XCheckTypedWindowEvent(pDVar8,ysXWnd,0x16,dif);
          bVar7 = true;
          bVar1 = bVar7;
          if (iVar10 == 1) {
            printf("%d %d %d %d\n",(ulong)local_168,(ulong)local_164,uVar11,(ulong)uVar3);
            uVar19 = uVar2 - local_168;
            uVar21 = uVar3 - local_164;
            bVar22 = uVar19 - 2 < 0xfffffffd;
            bVar23 = uVar21 - 2 < 0xfffffffd;
            bVar1 = bVar23 || bVar22;
            if (bVar23 || bVar22) {
              printf("dx %d dy %d\n",(ulong)uVar19,(ulong)uVar21);
              iVar10 = (int)uVar19 >> 0x1f;
              if (0 < (int)uVar19) {
                iVar10 = 1;
              }
              uVar15 = (ulong)(iVar10 + iVar14 + uVar19);
              if ((int)uVar21 < 1) {
                local_204 = (local_204 + uVar21) - (uint)(uVar3 != local_164);
                bVar1 = bVar7;
              }
              else {
                local_204 = local_204 + uVar21 + 1;
                bVar1 = bVar7;
              }
            }
          }
        } while (bVar1);
        ysXlupX = uVar2;
        ysXlupY = uVar3;
        puts("Zzz...");
        sleep(1);
        puts("Slept one second.");
        glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);
        glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
        glClear(0x4100);
        glFlush();
        glEnable(0xb71);
        glDepthFunc(0x203);
        glShadeModel(0x1d01);
        dif[0] = 0.8;
        dif[1] = 0.8;
        dif[2] = 0.8;
        dif[3] = 1.0;
        amb[0] = 0.4;
        amb[1] = 0.4;
        amb[2] = 0.4;
        amb[3] = 1.0;
        spc._0_8_ = 0x3f6666663f666666;
        spc[2] = 0.9;
        spc[3] = 1.0;
        shininess[0] = 50.0;
        shininess[1] = 50.0;
        shininess[2] = 50.0;
        shininess[3] = 0.0;
        glEnable(0xb50);
        glEnable(0x4000);
        glLightfv(0x4000,0x1201,dif);
        glLightfv(0x4000,0x1202,spc);
        glMaterialfv(0x405,0x1601,shininess);
        glLightModelfv(0xb53,amb);
        glEnable(0xb57);
        glEnable(0xba1);
        if (cVar20 == '\0') {
          glDrawBuffer(0x404);
        }
        glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
        glClearDepth(0);
        glDisable(0xb71);
        glViewport(0,0,iVar4,iVar5);
        glMatrixMode(0x1701);
        glLoadIdentity();
        glOrtho(0,(double)((float)iVar4 + -1.0),(double)((float)iVar5 + -1.0),0,0xbff0000000000000,
                0x3ff0000000000000);
        glMatrixMode(0x1700);
        glLoadIdentity();
        glShadeModel(0x1d00);
        glPointSize(0x3f800000);
        glClear(0x4100);
        glColor3ub(0,0,0);
        return;
      }
      goto LAB_0010fc01;
    }
  }
  FsOpenWindow();
LAB_0010fc01:
  FsOpenWindow();
  memset(mapXKtoFSKEY,0,0x40000);
  memset(mapXKtoChar,0,0x10000);
  memset(mapFSKEYtoXK,0,0x194);
  mapXKtoFSKEY[0x20] = 1;
  mapFSKEYtoXK[1] = 0x20;
  mapXKtoFSKEY[0x30] = 2;
  mapFSKEYtoXK[2] = 0x30;
  mapFSKEYtoXK[3] = 0x31;
  mapXKtoFSKEY[0x31] = 3;
  mapXKtoFSKEY[0x32] = 4;
  mapFSKEYtoXK[4] = 0x32;
  mapFSKEYtoXK[5] = 0x33;
  mapXKtoFSKEY[0x33] = 5;
  mapXKtoFSKEY[0x34] = 6;
  mapFSKEYtoXK[6] = 0x34;
  mapFSKEYtoXK[7] = 0x35;
  mapXKtoFSKEY[0x35] = 7;
  mapXKtoFSKEY[0x36] = 8;
  mapFSKEYtoXK[8] = 0x36;
  mapFSKEYtoXK[9] = 0x37;
  mapXKtoFSKEY[0x37] = 9;
  mapXKtoFSKEY[0x38] = 10;
  mapFSKEYtoXK[10] = 0x38;
  mapFSKEYtoXK[0xb] = 0x39;
  mapXKtoFSKEY[0x39] = 0xb;
  mapXKtoFSKEY[0x41] = 0xc;
  mapXKtoFSKEY[0x42] = 0xd;
  mapFSKEYtoXK[0xc] = 0x41;
  mapFSKEYtoXK[0xd] = 0x42;
  mapXKtoFSKEY[0x43] = 0xe;
  mapXKtoFSKEY[0x44] = 0xf;
  mapFSKEYtoXK[0xe] = 0x43;
  mapFSKEYtoXK[0xf] = 0x44;
  mapXKtoFSKEY[0x45] = 0x10;
  mapFSKEYtoXK[0x10] = 0x45;
  mapXKtoFSKEY[0x46] = 0x11;
  mapFSKEYtoXK[0x11] = 0x46;
  mapXKtoFSKEY[0x47] = 0x12;
  mapXKtoFSKEY[0x48] = 0x13;
  mapFSKEYtoXK[0x12] = 0x47;
  mapFSKEYtoXK[0x13] = 0x48;
  mapXKtoFSKEY[0x49] = 0x14;
  mapXKtoFSKEY[0x4a] = 0x15;
  mapFSKEYtoXK[0x14] = 0x49;
  mapFSKEYtoXK[0x15] = 0x4a;
  mapXKtoFSKEY[0x4b] = 0x16;
  mapFSKEYtoXK[0x16] = 0x4b;
  mapFSKEYtoXK[0x17] = 0x4c;
  mapXKtoFSKEY[0x4c] = 0x17;
  mapXKtoFSKEY[0x4d] = 0x18;
  mapFSKEYtoXK[0x18] = 0x4d;
  mapFSKEYtoXK[0x19] = 0x4e;
  mapXKtoFSKEY[0x4e] = 0x19;
  mapXKtoFSKEY[0x4f] = 0x1a;
  mapFSKEYtoXK[0x1a] = 0x4f;
  mapFSKEYtoXK[0x1b] = 0x50;
  mapXKtoFSKEY[0x50] = 0x1b;
  mapXKtoFSKEY[0x51] = 0x1c;
  mapFSKEYtoXK[0x1c] = 0x51;
  mapFSKEYtoXK[0x1d] = 0x52;
  mapXKtoFSKEY[0x52] = 0x1d;
  mapXKtoFSKEY[0x53] = 0x1e;
  mapFSKEYtoXK[0x1e] = 0x53;
  mapFSKEYtoXK[0x1f] = 0x54;
  mapXKtoFSKEY[0x54] = 0x1f;
  mapXKtoFSKEY[0x55] = 0x20;
  mapFSKEYtoXK[0x20] = 0x55;
  mapXKtoFSKEY[0x56] = 0x21;
  mapFSKEYtoXK[0x21] = 0x56;
  mapXKtoFSKEY[0x57] = 0x22;
  mapFSKEYtoXK[0x22] = 0x57;
  mapXKtoFSKEY[0x58] = 0x23;
  mapFSKEYtoXK[0x23] = 0x58;
  mapXKtoFSKEY[0x59] = 0x24;
  mapFSKEYtoXK[0x24] = 0x59;
  mapXKtoFSKEY[0x5a] = 0x25;
  mapFSKEYtoXK[0x25] = 0x5a;
  mapXKtoFSKEY[0xff1b] = 0x26;
  mapFSKEYtoXK[0x26] = 0xff1b;
  mapXKtoFSKEY[0xffbe] = 0x27;
  mapFSKEYtoXK[0x27] = 0xffbe;
  mapXKtoFSKEY[0xffbf] = 0x28;
  mapFSKEYtoXK[0x28] = 0xffbf;
  mapXKtoFSKEY[0xffc0] = 0x29;
  mapFSKEYtoXK[0x29] = 0xffc0;
  mapXKtoFSKEY[0xffc1] = 0x2a;
  mapFSKEYtoXK[0x2a] = 0xffc1;
  mapXKtoFSKEY[0xffc2] = 0x2b;
  mapFSKEYtoXK[0x2b] = 0xffc2;
  mapXKtoFSKEY[0xffc3] = 0x2c;
  mapFSKEYtoXK[0x2c] = 0xffc3;
  mapXKtoFSKEY[0xffc4] = 0x2d;
  mapFSKEYtoXK[0x2d] = 0xffc4;
  mapFSKEYtoXK[0x2e] = 0xffc5;
  mapFSKEYtoXK[0x2f] = 0xffc6;
  mapFSKEYtoXK[0x30] = 0xffc7;
  mapFSKEYtoXK[0x31] = 0xffc8;
  mapFSKEYtoXK[0x32] = 0xffc9;
  mapFSKEYtoXK[0x33] = 0;
  mapFSKEYtoXK[0x35] = 0;
  mapFSKEYtoXK[0x36] = 0xff69;
  mapFSKEYtoXK[0x48] = 0;
  mapFSKEYtoXK[0x49] = 0x2d;
  mapFSKEYtoXK[0x4a] = 0x2b;
  mapFSKEYtoXK[0x37] = 0xff08;
  mapFSKEYtoXK[0x38] = 0xff09;
  mapFSKEYtoXK[0x4b] = 0x5b;
  mapFSKEYtoXK[0x4c] = 0x5d;
  mapFSKEYtoXK[0x4d] = 0x5c;
  mapFSKEYtoXK[0x34] = 0;
  mapFSKEYtoXK[0x4e] = 0x3b;
  mapFSKEYtoXK[0x4f] = 0x27;
  mapFSKEYtoXK[0x39] = 0xff0d;
  mapFSKEYtoXK[0x3a] = 0xffe1;
  mapFSKEYtoXK[0x50] = 0x2c;
  mapXKtoFSKEY[0xffc5] = 0x2e;
  mapFSKEYtoXK[0x51] = 0x2e;
  mapXKtoFSKEY[0xffc6] = 0x2f;
  mapFSKEYtoXK[0x52] = 0x2f;
  mapXKtoFSKEY[0xffc7] = 0x30;
  mapXKtoFSKEY[0xffc8] = 0x31;
  mapXKtoFSKEY[0xffc9] = 0x32;
  mapXKtoFSKEY[0xff69] = 0x36;
  mapXKtoFSKEY[0x2d] = 0x49;
  mapXKtoFSKEY[0x2b] = 0x4a;
  mapXKtoFSKEY[0xff08] = 0x37;
  mapXKtoFSKEY[0xff09] = 0x38;
  mapXKtoFSKEY[0x5b] = 0x4b;
  mapXKtoFSKEY[0x5d] = 0x4c;
  mapXKtoFSKEY[0x5c] = 0x4d;
  mapXKtoFSKEY[0] = 0x34;
  mapXKtoFSKEY[0x3b] = 0x4e;
  mapXKtoFSKEY[0x27] = 0x4f;
  mapXKtoFSKEY[0xff0d] = 0x39;
  mapXKtoFSKEY[0xffe1] = 0x3a;
  mapXKtoFSKEY[0x2c] = 0x50;
  mapXKtoFSKEY[0x2e] = 0x51;
  mapXKtoFSKEY[0x2f] = 0x52;
  mapXKtoFSKEY[0xffe3] = 0x3b;
  mapXKtoFSKEY[0xffe9] = 0x3c;
  mapXKtoFSKEY[0xff63] = 0x3d;
  mapXKtoFSKEY[0xffff] = 0x3e;
  mapXKtoFSKEY[0xff50] = 0x3f;
  mapXKtoFSKEY[0xff57] = 0x40;
  mapXKtoFSKEY[0xff55] = 0x41;
  mapXKtoFSKEY[0xff56] = 0x42;
  mapXKtoFSKEY[0xff52] = 0x43;
  mapXKtoFSKEY[0xff54] = 0x44;
  mapXKtoFSKEY[0xff51] = 0x45;
  mapXKtoFSKEY[0xff53] = 0x46;
  mapXKtoFSKEY[0xff7f] = 0x47;
  mapXKtoFSKEY[0xffb0] = 0x53;
  mapXKtoFSKEY[0xffb1] = 0x54;
  mapXKtoFSKEY[0xffb2] = 0x55;
  mapXKtoFSKEY[0xffb3] = 0x56;
  mapXKtoFSKEY[0xffb4] = 0x57;
  mapXKtoFSKEY[0xffb5] = 0x58;
  mapXKtoFSKEY[0xffb6] = 0x59;
  mapXKtoFSKEY[0xffb7] = 0x5a;
  mapXKtoFSKEY[0xffb8] = 0x5b;
  mapXKtoFSKEY[0xffb9] = 0x5c;
  mapXKtoFSKEY[0xffae] = 0x5d;
  builtin_strncpy(mapXKtoChar + 0x20," !\"#$%&\'()",10);
  builtin_strncpy(mapXKtoChar + 0x2a,
                  "*+,-./0123456789;;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\]^_`abcdefghijklmnopqrstuvwxyz{|}~"
                  ,0x55);
  mapXKtoChar[0xff1b] = '\x1b';
  mapXKtoChar[0xff08] = '\b';
  mapXKtoChar[0xff09] = '\t';
  mapXKtoChar[0xff0d] = '\n';
  builtin_strncpy(mapXKtoChar + 0xffad,"-./0123456789",0xd);
  mapXKtoChar[0xffaa] = '*';
  mapXKtoChar[0xffab] = '+';
  mapXKtoChar[0xff8d] = '\n';
  mapFSKEYtoXK[0x3b] = 0xffe3;
  mapFSKEYtoXK[0x3c] = 0xffe9;
  mapFSKEYtoXK[0x3d] = 0xff63;
  mapFSKEYtoXK[0x3e] = 0xffff;
  mapFSKEYtoXK[0x3f] = 0xff50;
  mapFSKEYtoXK[0x40] = 0xff57;
  mapFSKEYtoXK[0x41] = 0xff55;
  mapFSKEYtoXK[0x42] = 0xff56;
  mapFSKEYtoXK[0x43] = 0xff52;
  mapFSKEYtoXK[0x44] = 0xff54;
  mapFSKEYtoXK[0x45] = 0xff51;
  mapFSKEYtoXK[0x46] = 0xff53;
  mapFSKEYtoXK[0x47] = 0xff7f;
  mapFSKEYtoXK[0x53] = 0xffb0;
  mapFSKEYtoXK[0x54] = 0xffb1;
  mapFSKEYtoXK[0x55] = 0xffb2;
  mapFSKEYtoXK[0x56] = 0xffb3;
  mapFSKEYtoXK[0x57] = 0xffb4;
  mapFSKEYtoXK[0x58] = 0xffb5;
  mapFSKEYtoXK[0x59] = 0xffb6;
  mapFSKEYtoXK[0x5a] = 0xffb7;
  mapFSKEYtoXK[0x5b] = 0xffb8;
  mapFSKEYtoXK[0x5c] = 0xffb9;
  mapFSKEYtoXK[0x5d] = 0xffae;
  mapXKtoFSKEY[0xffaf] = 0x5e;
  mapFSKEYtoXK[0x5e] = 0xffaf;
  mapXKtoFSKEY[0xffaa] = 0x5f;
  mapFSKEYtoXK[0x5f] = 0xffaa;
  mapXKtoFSKEY[0xffad] = 0x60;
  mapFSKEYtoXK[0x60] = 0xffad;
  mapXKtoFSKEY[0xffab] = 0x61;
  mapFSKEYtoXK[0x61] = 0xffab;
  mapXKtoFSKEY[0xff8d] = 0x62;
  mapFSKEYtoXK[0x62] = 0xff8d;
  return;
}

Assistant:

void FsOpenWindow(const FsOpenWindowOption &opt)
{
	int x0=opt.x0;
	int y0=opt.y0;
	int wid=opt.wid;
	int hei=opt.hei;
	int useDoubleBuffer=(int)opt.useDoubleBuffer;
	// int useMultiSampleBuffer=(int)opt.useMultiSampleBuffer;
	const char *title=(NULL!=opt.windowTitle ? opt.windowTitle : "Main Window");

	int n;
	char **m,*def;
	XSetWindowAttributes swa;
	Font font;

	int lupX,lupY,sizX,sizY;
	lupX=x0;
	lupY=y0;
	sizX=wid;
	sizY=hei;

	FsXCreateKeyMapping();
	for(n=0; n<FSKEY_NUM_KEYCODE; n++)
	{
		fsKeyPress[n]=0;
	}

	ysXDsp=XOpenDisplay(NULL);

	if(ysXDsp!=NULL)
	{
		printf("Opened display.\n");
		if(glXQueryExtension(ysXDsp,NULL,NULL)!=0)
		{
			printf("Acquired GLX extension.\n");

			int tryAlternativeSingleBuffer=0;
			if(useDoubleBuffer!=0)
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
			}
			else
			{
				ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgSingle);
				if(NULL==ysXVis)
				{
					ysXVis=glXChooseVisual(ysXDsp,DefaultScreen(ysXDsp),ysGlxCfgDouble);
					tryAlternativeSingleBuffer=1;
				}
			}

			printf("Chose visual.\n");

			if(ysXVis!=NULL)
			{
				ysXCMap=XCreateColormap(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),ysXVis->visual,AllocNone);
				printf("Created colormap.\n");

				ysGlRC=glXCreateContext(ysXDsp,ysXVis,None,GL_TRUE);
				if(ysGlRC!=NULL)
				{
					printf("Created OpenGL context.\n");

					swa.colormap=ysXCMap;
					swa.border_pixel=0;
					swa.event_mask=ysXEventMask;

					// Memo: lupX and lupY given to XCreateWindow will be ignored.
					//       Window must be moved to the desired position by XMoveWindow after XMapWindow.
					ysXWnd=XCreateWindow(ysXDsp,RootWindow(ysXDsp,ysXVis->screen),
							  lupX,lupY,sizX,sizY,
					                  1,
							  ysXVis->depth,
					                  InputOutput,
							  ysXVis->visual,
					                  CWEventMask|CWBorderPixel|CWColormap,&swa);

					printf("Created Window.\n");

					ysXWid=sizX;
					ysXHei=sizY;
					ysXlupX=lupX;
					ysXlupY=lupY;

					XStoreName(ysXDsp,ysXWnd,title);


// Should I use XSetWMProperties? titlebar problem.
					XWMHints wmHints;
					wmHints.flags=0;
					wmHints.initial_state=NormalState;
					XSetWMHints(ysXDsp,ysXWnd,&wmHints);


					XSetIconName(ysXDsp,ysXWnd,title);
					XMapWindow(ysXDsp,ysXWnd);

					// Memo: XCreateWindow probably ignore lupX and lupY.  Window must be moved here.
					ForceMoveWindow(ysXDsp,ysXWnd,lupX,lupY);
					// ForceMoveWindow may have failed to place the window, but let's at least reset lupX and lupY.
					ysXlupX=lupX;
					ysXlupY=lupY;

					printf("Zzz...\n");
					sleep(1);
					printf("Slept one second.\n");

					/* printf("Wait Expose Event\n");
					XEvent ev;
					while(XCheckTypedEvent(ysXDsp,Expose,&ev)!=True)
					  {
					    printf("Waiting for create notify\n");
					    sleep(1);
					  }
					printf("Window=%d\n",ev.xexpose.window);
					printf("Window Created\n"); */

					glXMakeCurrent(ysXDsp,ysXWnd,ysGlRC);

					// These lines are needed, or window will not appear >>
				    glClearColor(1.0F,1.0F,1.0F,0.0F);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glFlush();
					// glXSwapBuffers(ysXDsp,ysXWnd);
					// These lines are needed, or window will not appear <<

					glEnable(GL_DEPTH_TEST);
					glDepthFunc(GL_LEQUAL);
					glShadeModel(GL_SMOOTH);

					GLfloat dif[]={0.8F,0.8F,0.8F,1.0F};
					GLfloat amb[]={0.4F,0.4F,0.4F,1.0F};
					GLfloat spc[]={0.9F,0.9F,0.9F,1.0F};
					GLfloat shininess[]={50.0,50.0,50.0,0.0};

					glEnable(GL_LIGHTING);
					glEnable(GL_LIGHT0);
					glLightfv(GL_LIGHT0,GL_DIFFUSE,dif);
					glLightfv(GL_LIGHT0,GL_SPECULAR,spc);
					glMaterialfv(GL_FRONT|GL_BACK,GL_SHININESS,shininess);

					glLightModelfv(GL_LIGHT_MODEL_AMBIENT,amb);
					glEnable(GL_COLOR_MATERIAL);
					glEnable(GL_NORMALIZE);

					if(0!=tryAlternativeSingleBuffer)
					{
						glDrawBuffer(GL_FRONT);
					}

				    glClearColor(1.0F,1.0F,1.0F,0.0F);
				    glClearDepth(1.0F);
					glDisable(GL_DEPTH_TEST);

					glViewport(0,0,sizX,sizY);

				    glMatrixMode(GL_PROJECTION);
					glLoadIdentity();
					glOrtho(0,(float)sizX-1,(float)sizY-1,0,-1,1);

					glMatrixMode(GL_MODELVIEW);
					glLoadIdentity();

					glShadeModel(GL_FLAT);
					glPointSize(1);
					glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT);
					glColor3ub(0,0,0);
				}
				else
				{
					fprintf(stderr,"Cannot create OpenGL context.\n");
					exit(1);
				}
			}
			else
			{
				fprintf(stderr,"Double buffer not supported?\n");
				exit(1);
			}
		}
		else
		{
			fprintf(stderr,"This system doesn't support OpenGL.\n");
			exit(1);
		}
	}
	else
	{
		fprintf(stderr,"Cannot Open Display.\n");
		exit(1);
	}

	return;
}